

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

void __thiscall
tvm::runtime::TVMRetValue::MoveToCHost
          (TVMRetValue *this,TVMValue_conflict *ret_value,int *ret_type_code)

{
  ostringstream *poVar1;
  ostream *poVar2;
  LogMessageFatal local_1a8;
  int *local_20;
  int *ret_type_code_local;
  TVMValue_conflict *ret_value_local;
  TVMRetValue *this_local;
  
  local_20 = ret_type_code;
  ret_type_code_local = (int *)ret_value;
  if (((this->super_TVMPODValue_).type_code_ == 0xb) ||
     ((this->super_TVMPODValue_).type_code_ == 0xc)) {
    ret_value_local = (TVMValue_conflict *)this;
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x30f);
    poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a8);
    poVar2 = std::operator<<((ostream *)poVar1,
                             "Check failed: type_code_ != kStr && type_code_ != kBytes");
    std::operator<<(poVar2,": ");
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
  }
  *(TVMValue_conflict *)ret_type_code_local = (this->super_TVMPODValue_).value_;
  *local_20 = (this->super_TVMPODValue_).type_code_;
  (this->super_TVMPODValue_).type_code_ = 4;
  return;
}

Assistant:

void MoveToCHost(TVMValue *ret_value,
                   int *ret_type_code) {
    // cannot move str; need specially handle.
    CHECK(type_code_ != kStr && type_code_ != kBytes);
    *ret_value = value_;
    *ret_type_code = type_code_;
    type_code_ = kNull;
  }